

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O0

xmlMutexPtr xmlNewMutex(void)

{
  xmlMutexPtr tok;
  
  tok = (xmlMutexPtr)malloc(0x28);
  if ((pthread_mutex_t *)tok == (pthread_mutex_t *)0x0) {
    tok = (xmlMutexPtr)0x0;
  }
  else if (libxml_is_threaded != 0) {
    pthread_mutex_init((pthread_mutex_t *)tok,(pthread_mutexattr_t *)0x0);
  }
  return tok;
}

Assistant:

xmlMutexPtr
xmlNewMutex(void)
{
    xmlMutexPtr tok;

    if ((tok = malloc(sizeof(xmlMutex))) == NULL)
        return (NULL);
#ifdef HAVE_POSIX_THREADS
    if (libxml_is_threaded != 0)
        pthread_mutex_init(&tok->lock, NULL);
#elif defined HAVE_WIN32_THREADS
    InitializeCriticalSection(&tok->cs);
#endif
    return (tok);
}